

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

void __thiscall BlurayHelper::createBluRayDirs(BlurayHelper *this)

{
  IsoWriter *pIVar1;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  allocator<char> local_671;
  string local_670;
  string local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator<char> local_609;
  string local_608;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  allocator<char> local_539;
  string local_538;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  allocator<char> local_469;
  string local_468;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  BlurayHelper *local_10;
  BlurayHelper *this_local;
  
  local_10 = this;
  if (this->m_dt == BLURAY) {
    if (this->m_isoWriter == (IsoWriter *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"BDMV/META",&local_149);
      toNativeSeparators(&local_128,&local_148);
      std::operator+(&local_108,&this->m_dstPath,&local_128);
      createDir(&local_108,true);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"BDMV/BDJO",&local_1b1);
      toNativeSeparators(&local_190,&local_1b0);
      std::operator+(&local_170,&this->m_dstPath,&local_190);
      createDir(&local_170,true);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"BDMV/JAR",&local_219)
      ;
      toNativeSeparators(&local_1f8,&local_218);
      std::operator+(&local_1d8,&this->m_dstPath,&local_1f8);
      createDir(&local_1d8,true);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"BDMV/BACKUP/BDJO",&local_281);
      toNativeSeparators(&local_260,&local_280);
      std::operator+(&local_240,&this->m_dstPath,&local_260);
      createDir(&local_240,true);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"BDMV/BACKUP/JAR",&local_2e9);
      toNativeSeparators(&local_2c8,&local_2e8);
      std::operator+(&local_2a8,&this->m_dstPath,&local_2c8);
      createDir(&local_2a8,true);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
    }
    else {
      pIVar1 = this->m_isoWriter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/META",&local_31);
      IsoWriter::createDir(pIVar1,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::allocator<char>::~allocator(&local_31);
      pIVar1 = this->m_isoWriter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"BDMV/BDJO",&local_69);
      IsoWriter::createDir(pIVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      pIVar1 = this->m_isoWriter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"BDMV/JAR",&local_91);
      IsoWriter::createDir(pIVar1,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      pIVar1 = this->m_isoWriter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BDMV/BACKUP/BDJO",&local_b9);
      IsoWriter::createDir(pIVar1,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      pIVar1 = this->m_isoWriter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"BDMV/BACKUP/JAR",&local_e1);
      IsoWriter::createDir(pIVar1,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"CERTIFICATE/BACKUP",&local_469);
    toNativeSeparators(&local_448,&local_468);
    std::operator+(&local_428,&this->m_dstPath,&local_448);
    createDir(&local_428,true);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"BDMV/AUXDATA",&local_4d1);
    toNativeSeparators(&local_4b0,&local_4d0);
    std::operator+(&local_490,&this->m_dstPath,&local_4b0);
    createDir(&local_490,true);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_538,"BDMV/CLIPINF",&local_539);
    toNativeSeparators(&local_518,&local_538);
    std::operator+(&local_4f8,&this->m_dstPath,&local_518);
    createDir(&local_4f8,true);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator(&local_539);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"BDMV/PLAYLIST",&local_5a1);
    toNativeSeparators(&local_580,&local_5a0);
    std::operator+(&local_560,&this->m_dstPath,&local_580);
    createDir(&local_560,true);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"BDMV/STREAM",&local_609);
    toNativeSeparators(&local_5e8,&local_608);
    std::operator+(&local_5c8,&this->m_dstPath,&local_5e8);
    createDir(&local_5c8,true);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"BDMV/BACKUP/CLIPINF",&local_671);
    toNativeSeparators(&local_650,&local_670);
    std::operator+(&local_630,&this->m_dstPath,&local_650);
    createDir(&local_630,true);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"BDMV/BACKUP/PLAYLIST",&local_6d9);
    toNativeSeparators(&local_6b8,&local_6d8);
    std::operator+(&local_698,&this->m_dstPath,&local_6b8);
    createDir(&local_698,true);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
  }
  else {
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"CERTIFICATE/BACKUP",&local_311);
    IsoWriter::createDir(pIVar1,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"BDMV/AUXDATA",&local_339);
    IsoWriter::createDir(pIVar1,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"BDMV/CLIPINF",&local_361);
    IsoWriter::createDir(pIVar1,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"BDMV/PLAYLIST",&local_389);
    IsoWriter::createDir(pIVar1,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator(&local_389);
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"BDMV/STREAM",&local_3b1);
    IsoWriter::createDir(pIVar1,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"BDMV/BACKUP/CLIPINF",&local_3d9);
    IsoWriter::createDir(pIVar1,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    pIVar1 = this->m_isoWriter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"BDMV/BACKUP/PLAYLIST",&local_401);
    IsoWriter::createDir(pIVar1,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
  }
  return;
}

Assistant:

void BlurayHelper::createBluRayDirs() const
{
    if (m_dt == DiskType::BLURAY)
    {
        if (m_isoWriter)
        {
            m_isoWriter->createDir("BDMV/META");
            m_isoWriter->createDir("BDMV/BDJO");
            m_isoWriter->createDir("BDMV/JAR");
            m_isoWriter->createDir("BDMV/BACKUP/BDJO");
            m_isoWriter->createDir("BDMV/BACKUP/JAR");
        }
        else
        {
            createDir(m_dstPath + toNativeSeparators("BDMV/META"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/BDJO"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/JAR"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/BDJO"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/JAR"), true);
        }
    }

    if (m_isoWriter)
    {
        m_isoWriter->createDir("CERTIFICATE/BACKUP");
        m_isoWriter->createDir("BDMV/AUXDATA");

        m_isoWriter->createDir("BDMV/CLIPINF");
        m_isoWriter->createDir("BDMV/PLAYLIST");
        m_isoWriter->createDir("BDMV/STREAM");
        m_isoWriter->createDir("BDMV/BACKUP/CLIPINF");
        m_isoWriter->createDir("BDMV/BACKUP/PLAYLIST");
    }
    else
    {
        createDir(m_dstPath + toNativeSeparators("CERTIFICATE/BACKUP"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/AUXDATA"), true);

        createDir(m_dstPath + toNativeSeparators("BDMV/CLIPINF"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/PLAYLIST"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/STREAM"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/CLIPINF"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/PLAYLIST"), true);
    }
}